

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

With * withDup(sqlite3 *db,With *p)

{
  Select *pSVar1;
  ExprList *pEVar2;
  char *pcVar3;
  int local_2c;
  int i;
  sqlite3_int64 nByte;
  With *pRet;
  With *p_local;
  sqlite3 *db_local;
  
  nByte = 0;
  if ((p != (With *)0x0) &&
     (nByte = (sqlite3_int64)sqlite3DbMallocZero(db,(long)(p->nCte + -1) * 0x20 + 0x30),
     (int *)nByte != (int *)0x0)) {
    *(int *)nByte = p->nCte;
    for (local_2c = 0; local_2c < p->nCte; local_2c = local_2c + 1) {
      pSVar1 = sqlite3SelectDup(db,p->a[local_2c].pSelect,0);
      *(Select **)(nByte + ((long)local_2c * 8 + 8) * 4) = pSVar1;
      pEVar2 = sqlite3ExprListDup(db,p->a[local_2c].pCols,0);
      *(ExprList **)(nByte + ((long)local_2c * 8 + 6) * 4) = pEVar2;
      pcVar3 = sqlite3DbStrDup(db,p->a[local_2c].zName);
      *(char **)(nByte + ((long)local_2c * 8 + 4) * 4) = pcVar3;
    }
  }
  return (With *)nByte;
}

Assistant:

static With *withDup(sqlite3 *db, With *p){
  With *pRet = 0;
  if( p ){
    sqlite3_int64 nByte = sizeof(*p) + sizeof(p->a[0]) * (p->nCte-1);
    pRet = sqlite3DbMallocZero(db, nByte);
    if( pRet ){
      int i;
      pRet->nCte = p->nCte;
      for(i=0; i<p->nCte; i++){
        pRet->a[i].pSelect = sqlite3SelectDup(db, p->a[i].pSelect, 0);
        pRet->a[i].pCols = sqlite3ExprListDup(db, p->a[i].pCols, 0);
        pRet->a[i].zName = sqlite3DbStrDup(db, p->a[i].zName);
      }
    }
  }
  return pRet;
}